

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O0

value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> * __thiscall
nonstd::vptr::value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>::
operator=(value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *this,
         value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *rhs)

{
  bool bVar1;
  reference v;
  value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *rhs_local;
  value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *this_local;
  
  if (this != rhs) {
    bVar1 = vptr::value_ptr::operator_cast_to_bool((value_ptr *)rhs);
    if (bVar1) {
      v = operator*(rhs);
      detail::
      compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>::
      reset(&this->ptr,v);
    }
    else {
      detail::
      compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>::
      reset(&this->ptr,(pointer)0x0);
    }
  }
  return this;
}

Assistant:

value_ptr & operator=( value_ptr const & rhs )
    {
        if ( this == &rhs )
            return *this;

        if ( rhs ) ptr.reset( *rhs );
#if nsvp_HAVE_NULLPTR
        else       ptr.reset( nullptr );
#else
        else       ptr.reset( pointer(0) );
#endif
        return *this;
    }